

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::SchemaParser::ModuleImpl::embedRelative
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,ModuleImpl *this,
          StringPtr embedPath)

{
  SchemaFile *pSVar1;
  undefined4 uVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  long *plVar6;
  undefined4 uVar7;
  undefined8 local_38;
  undefined8 uStack_30;
  ArrayDisposer *local_28;
  
  pSVar1 = (this->file).ptr;
  (*pSVar1->_vptr_SchemaFile[2])(&local_38,pSVar1,embedPath.content.ptr,embedPath.content.size_);
  plVar6 = uStack_30;
  puVar3 = local_38;
  if (uStack_30 == (long *)0x0) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    (**(code **)(*uStack_30 + 8))(&local_38,uStack_30);
    uVar2 = (undefined4)local_38;
    uVar4 = local_38._4_4_;
    uVar5 = (undefined4)uStack_30;
    uVar7 = uStack_30._4_4_;
    local_38 = (undefined8 *)0x0;
    uStack_30 = (long *)0x0;
    (__return_storage_ptr__->ptr).isSet = true;
    *(undefined4 *)&(__return_storage_ptr__->ptr).field_1 = uVar2;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 4) = uVar4;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = uVar5;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xc) = uVar7;
    (__return_storage_ptr__->ptr).field_1.value.disposer = local_28;
    (**(code **)*puVar3)(puVar3,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<const byte>> embedRelative(kj::StringPtr embedPath) override {
    KJ_IF_MAYBE(importedFile, file->import(embedPath)) {
      return importedFile->get()->readContent().releaseAsBytes();
    } else {
      return nullptr;
    }
  }